

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::
JsonIntRangeSetValReqBase(JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *this)

{
  undefined1 local_61;
  Sp local_60;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  optional<unsigned_long_long> local_40;
  optional<unsigned_long_long> local_30;
  
  local_30.super_type.m_initialized = true;
  local_30.super_type.m_storage = 1;
  local_40.super_type.m_initialized = false;
  local_50 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>,std::allocator<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>>>
            (&_Stack_48,(JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq> **)&local_50,
             (allocator<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>_>
              *)&local_61);
  local_60.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_50;
  local_60.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_48._M_pi;
  JsonArrayValReq::JsonArrayValReq(&this->super_JsonArrayValReq,&local_30,&local_40,&local_60);
  if (local_60.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_JsonArrayValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonArrayValReq_00300f80;
  return;
}

Assistant:

explicit JsonIntRangeSetValReqBase() :
        JsonArrayValReq {1, boost::none, JsonIntRangeValReqBase<JsonIntValReqT>::shared()}
    {
    }